

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O2

int32_t sysbvm_integer_subtractFromInto
                  (size_t leftWordCount,uint32_t *leftWords,size_t rightWordCount,
                  uint32_t *rightWords,size_t resultWordCount,uint32_t *resultWords)

{
  size_t i_1;
  size_t sVar1;
  ulong uVar2;
  size_t i;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  sVar1 = rightWordCount;
  if (rightWordCount < leftWordCount) {
    sVar1 = leftWordCount;
  }
  uVar2 = 0;
  for (uVar3 = 0; sVar1 != uVar3; uVar3 = uVar3 + 1) {
    if (uVar3 < leftWordCount) {
      uVar4 = (ulong)leftWords[uVar3];
    }
    else {
      uVar4 = 0;
    }
    if (uVar3 < rightWordCount) {
      uVar5 = (ulong)rightWords[uVar3];
    }
    else {
      uVar5 = 0;
    }
    uVar2 = ((long)uVar2 >> 0x20) + (uVar4 - uVar5);
    if (uVar3 < resultWordCount) {
      resultWords[uVar3] = (uint32_t)uVar2;
    }
    uVar2 = uVar2 & 0xffffffff00000000;
  }
  for (; sVar1 < resultWordCount; sVar1 = sVar1 + 1) {
    resultWords[sVar1] = 0;
  }
  return (int32_t)sVar1;
}

Assistant:

static int32_t sysbvm_integer_subtractFromInto(size_t leftWordCount, uint32_t *leftWords, size_t rightWordCount, uint32_t *rightWords, size_t resultWordCount, uint32_t *resultWords)
{
    int32_t borrow = 0;
    
    size_t wordsToSum = leftWordCount > rightWordCount ? leftWordCount : rightWordCount;
    for(size_t i = 0; i < wordsToSum; ++i)
    {
        uint32_t leftWord = i < leftWordCount ? leftWords[i] : 0;
        uint32_t rightWord = i < rightWordCount ? rightWords[i] : 0;

        int64_t subtraction = (int64_t)leftWord - (int64_t)rightWord + (int64_t)borrow;
        uint32_t subtractionWord = (uint32_t)subtraction;
        if(i < resultWordCount)
            resultWords[i] = subtractionWord;

        borrow = (int32_t)(subtraction >> 32);
    }

    for(size_t i = wordsToSum; i < resultWordCount; ++i)
    {
        if(i < resultWordCount)
            resultWords[i] = 0;
    }

    return borrow;
}